

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fMultisampleTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_0::DefaultFBOMultisampleCase::randomizeViewport
          (DefaultFBOMultisampleCase *this)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  RenderTarget *pRVar6;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pRVar6 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar1 = pRVar6->m_width;
  iVar2 = this->m_viewportSize;
  dVar5 = deRandom_getUint32(&(this->m_rnd).m_rnd);
  this->m_viewportX = dVar5 % ((iVar1 - iVar2) + 1U);
  pRVar6 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar1 = pRVar6->m_height;
  iVar2 = this->m_viewportSize;
  dVar5 = deRandom_getUint32(&(this->m_rnd).m_rnd);
  uVar3 = (ulong)dVar5 % (ulong)((iVar1 - iVar2) + 1);
  this->m_viewportY = (int)uVar3;
  (**(code **)(CONCAT44(extraout_var,iVar4) + 0x1a00))(this->m_viewportX,uVar3,this->m_viewportSize)
  ;
  dVar5 = (**(code **)(CONCAT44(extraout_var,iVar4) + 0x800))();
  glu::checkError(dVar5,"viewport",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleTests.cpp"
                  ,0x180);
  return;
}

Assistant:

void DefaultFBOMultisampleCase::randomizeViewport (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	m_viewportX = m_rnd.getInt(0, m_context.getRenderTarget().getWidth()  - m_viewportSize);
	m_viewportY = m_rnd.getInt(0, m_context.getRenderTarget().getHeight() - m_viewportSize);

	gl.viewport(m_viewportX, m_viewportY, m_viewportSize, m_viewportSize);
	GLU_EXPECT_NO_ERROR(gl.getError(), "viewport");
}